

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_int>::updateHandle
          (btAxisSweep3Internal<unsigned_int> *this,uint handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  uint edge;
  uint edge_00;
  Handle *pHVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint max [3];
  uint min [3];
  
  pHVar1 = this->m_pHandles;
  quantize(this,min,aabbMin,0);
  quantize(this,max,aabbMax,1);
  for (lVar5 = -3; lVar5 != 0; lVar5 = lVar5 + 1) {
    edge = pHVar1[handle].m_maxEdges[lVar5];
    edge_00 = pHVar1[handle].m_maxEdges[lVar5 + 3];
    pvVar2 = this->m_pEdgesRawPtr[lVar5];
    iVar4 = min[lVar5] - *(int *)((long)pvVar2 + (ulong)edge_00 * 8);
    iVar6 = *(int *)(&stack0xffffffffffffffd0 + lVar5 * 4) -
            *(int *)((long)pvVar2 + (ulong)edge * 8);
    *(int *)((long)pvVar2 + (ulong)edge * 8) = *(int *)(&stack0xffffffffffffffd0 + lVar5 * 4);
    *(uint *)((long)pvVar2 + (ulong)edge_00 * 8) = min[lVar5];
    iVar3 = (int)lVar5;
    if (iVar6 < 0) {
      sortMinDown(this,iVar3 + 3,edge,dispatcher,true);
    }
    if (0 < iVar4) {
      sortMaxUp(this,iVar3 + 3,edge_00,dispatcher,true);
    }
    if (0 < iVar6) {
      sortMinUp(this,iVar3 + 3,edge,dispatcher,true);
    }
    if (iVar4 < 0) {
      sortMaxDown(this,iVar3 + 3,edge_00,dispatcher,true);
    }
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}